

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall Centaurus::DFA<wchar_t>::redirect_transitions(DFA<wchar_t> *this,int from,int to)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *this_00;
  reference this_01;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_02;
  reference this_03;
  NFATransition<wchar_t> *t;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range3;
  DFAState<wchar_t> *s;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *__range2;
  int to_local;
  int from_local;
  DFA<wchar_t> *this_local;
  
  this_00 = &(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states;
  __end0 = std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ::begin(this_00);
  s = (DFAState<wchar_t> *)
      std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::end
                (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
                                *)&s);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
              ::operator*(&__end0);
    this_02 = NFABaseState<wchar_t,_Centaurus::IndexVector>::get_transitions
                        (&this_01->super_NFABaseState<wchar_t,_Centaurus::IndexVector>);
    __end0_1 = std::
               vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ::begin(this_02);
    t = (NFATransition<wchar_t> *)
        std::
        vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
        ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0_1,
                         (__normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                          *)&t);
      if (!bVar1) break;
      this_03 = __gnu_cxx::
                __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                ::operator*(&__end0_1);
      iVar2 = NFATransition<wchar_t>::dest(this_03);
      if (iVar2 == from) {
        NFATransition<wchar_t>::dest(this_03,to);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<Centaurus::DFAState<wchar_t>_*,_std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void redirect_transitions(int from, int to)
    {
        for (auto& s : m_states)
        {
            for (auto& t : s.get_transitions())
            {
                if (t.dest() == from)
                {
                    t.dest(to);
                }
            }
        }
    }